

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.cpp
# Opt level: O0

int __thiscall
CVmObjDict::getp_is_defined(CVmObjDict *this,vm_obj_id_t self,vm_val_t *val,uint *argc)

{
  int iVar1;
  vm_val_t *pvVar2;
  uint *in_RCX;
  vm_val_t *in_RDX;
  vm_val_t *in_RDI;
  isdef_ctx ctx;
  uint hash;
  vm_val_t filter;
  size_t strl;
  char *strp;
  vm_val_t *arg0;
  uint orig_argc;
  vm_val_t *in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  uint uVar3;
  int in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  undefined4 in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  isdef_ctx *in_stack_ffffffffffffff20;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  vm_val_t *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  vm_val_t local_60;
  size_t local_50;
  char *local_48;
  vm_val_t *local_40;
  uint local_38;
  uint *local_28;
  vm_val_t *local_20;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  if ((getp_is_defined(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_is_defined(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_is_defined::desc,1,1);
    __cxa_guard_release(&getp_is_defined(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  if (local_28 == (uint *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = *local_28;
  }
  local_38 = uVar3;
  iVar1 = CVmObject::get_prop_check_argc
                    (in_RDI,(uint *)CONCAT44(uVar3,in_stack_ffffffffffffff00),
                     (CVmNativeCodeDesc *)in_stack_fffffffffffffef8);
  if (iVar1 == 0) {
    local_40 = CVmStack::get(0);
    local_48 = vm_val_t::get_as_string(in_stack_fffffffffffffef8);
    if (local_48 == (char *)0x0) {
      err_throw(0);
    }
    local_50 = vmb_get_len((char *)0x328013);
    local_48 = local_48 + 2;
    if (local_38 < 2) {
      vm_val_t::set_nil(&local_60);
    }
    else {
      pvVar2 = CVmStack::get(1);
      local_60.typ = pvVar2->typ;
      local_60._4_4_ = *(undefined4 *)&pvVar2->field_0x4;
      local_60.val = pvVar2->val;
    }
    calc_str_hash((CVmObjDict *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                  in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                  (size_t)in_stack_ffffffffffffff80);
    isdef_ctx::isdef_ctx
              (in_stack_ffffffffffffff20,
               (CVmObjDict *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
               (vm_val_t *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),in_RDI,
               (char *)CONCAT44(uVar3,in_stack_ffffffffffffff00),(size_t)in_stack_fffffffffffffef8);
    vm_rcdesc::init((vm_rcdesc *)&stack0xffffffffffffff50,(EVP_PKEY_CTX *)"Dict.isDefined");
    get_ext((CVmObjDict *)in_RDI);
    CVmHashTable::enum_hash_matches
              ((CVmHashTable *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c,
               (_func_void_void_ptr_CVmHashEntry_ptr *)
               CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),in_RDI);
    vm_val_t::set_logical(local_20,in_stack_ffffffffffffff10);
    CVmStack::discard(local_38);
  }
  return 1;
}

Assistant:

int CVmObjDict::getp_is_defined(VMG_ vm_obj_id_t self, vm_val_t *val,
                                uint *argc)
{
    static CVmNativeCodeDesc desc(1, 1);
    uint orig_argc = (argc == 0 ? 0 : *argc);
    vm_val_t *arg0;
    const char *strp;
    size_t strl;
    vm_val_t filter;
    unsigned int hash;
    
    /* check arguments */
    if (get_prop_check_argc(val, argc, &desc))
        return TRUE;

    /* 
     *   make sure the argument is a string, but leave it on the stack for
     *   gc protection 
     */
    arg0 = G_stk->get(0);
    if ((strp = arg0->get_as_string(vmg0_)) == 0)
        err_throw(VMERR_STRING_VAL_REQD);

    /* read and skip the string's length prefix */
    strl = vmb_get_len(strp);
    strp += VMB_LEN;

    /* if there's a second argument, it's the filter function */
    if (orig_argc >= 2)
    {
        /* retrieve the filter */
        filter = *G_stk->get(1);
    }
    else
    {
        /* there's no filter */
        filter.set_nil();
    }

    /* calculate the hash code */
    hash = calc_str_hash(vmg_ arg0, strp, strl);

    /* enumerate matches for the string */
    isdef_ctx ctx(vmg_ this, &filter, arg0, strp, strl);
    ctx.rc.init(vmg_ "Dict.isDefined", self, 5, arg0, orig_argc);
    get_ext()->hashtab_->enum_hash_matches(hash, &isdef_cb, &ctx);

    /* if we found any matches, return true; otherwise, return nil */
    val->set_logical(ctx.found);

    /* discard arguments */
    G_stk->discard(orig_argc);

    /* success */
    return TRUE;
}